

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabLong(uint32_t *lp)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  uint32_t *lp_local;
  
  uVar1 = *(undefined1 *)((long)lp + 3);
  *(char *)((long)lp + 3) = (char)*lp;
  *(undefined1 *)lp = uVar1;
  uVar1 = *(undefined1 *)((long)lp + 2);
  *(undefined1 *)((long)lp + 2) = *(undefined1 *)((long)lp + 1);
  *(undefined1 *)((long)lp + 1) = uVar1;
  return;
}

Assistant:

void TIFFSwabLong(uint32_t *lp)
{
    register unsigned char *cp = (unsigned char *)lp;
    unsigned char t;
    assert(sizeof(uint32_t) == 4);
    t = cp[3];
    cp[3] = cp[0];
    cp[0] = t;
    t = cp[2];
    cp[2] = cp[1];
    cp[1] = t;
}